

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::ActivationLayer::outputInplace(ActivationLayer *this,Array *inputs)

{
  element_type *peVar1;
  size_t sVar2;
  element_type *peVar3;
  Activation *pAVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float extraout_XMM0_Da;
  
  peVar1 = (this->super_ABackpropLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = this->nSize;
  if (peVar1->_M_size != sVar2) {
    operator_delete(peVar1->_M_data);
    peVar1->_M_size = sVar2;
    pfVar5 = (float *)operator_new(sVar2 * 4);
    peVar1->_M_data = pfVar5;
    if (sVar2 != 0) {
      memset(pfVar5,0,sVar2 * 4);
    }
  }
  peVar3 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = peVar3->_M_size;
  if (sVar2 == inputs->_M_size) {
    if (sVar2 == 0) goto LAB_0011a398;
    pfVar5 = peVar3->_M_data;
    pfVar6 = inputs->_M_data;
  }
  else {
    if (peVar3->_M_data != (float *)0x0) {
      operator_delete(peVar3->_M_data);
    }
    sVar2 = inputs->_M_size;
    peVar3->_M_size = sVar2;
    pfVar5 = (float *)operator_new(sVar2 << 2);
    peVar3->_M_data = pfVar5;
    pfVar6 = inputs->_M_data;
    if (pfVar6 == (float *)0x0) goto LAB_0011a398;
    sVar2 = peVar3->_M_size;
  }
  memcpy(pfVar5,pfVar6,sVar2 << 2);
LAB_0011a398:
  pfVar6 = inputs->_M_data;
  pfVar5 = pfVar6 + inputs->_M_size;
  if (inputs->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  if (pfVar6 != pfVar5) {
    pfVar7 = (float *)peVar1->_M_size;
    if (pfVar7 != (float *)0x0) {
      pfVar7 = peVar1->_M_data;
    }
    pAVar4 = this->activationFunction;
    do {
      (*pAVar4->_vptr_Activation[1])(*pfVar6,pAVar4);
      *pfVar7 = extraout_XMM0_Da;
      pfVar6 = pfVar6 + 1;
      pfVar7 = pfVar7 + 1;
    } while (pfVar6 != pfVar5);
  }
  return;
}

Assistant:

virtual void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nSize) {
            outputs.resize(nSize);
        }
        *shared.inputBuffer = inputs;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(outputs),
            [&](float y) { return activation(y); });
    }